

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O1

bool __thiscall
vkt::shaderexecutor::BitfieldExtractCaseInstance::compare
          (BitfieldExtractCaseInstance *this,void **inputs,void **outputs)

{
  DataType dataType;
  int iVar1;
  ostream *stream;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ostringstream *this_00;
  Hex<8UL> local_38;
  
  dataType = (((this->super_IntegerFunctionTestInstance).m_spec.inputs.
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_start)->varType).m_data.basic.type;
  iVar1 = glu::getDataTypeScalarSize(dataType);
  bVar3 = iVar1 < 1;
  if (0 < iVar1) {
    bVar2 = (byte)*inputs[2];
    uVar4 = ~(-1 << (bVar2 & 0x1f));
    if (*inputs[2] == 0x20) {
      uVar4 = 0xffffffff;
    }
    lVar5 = 0;
    do {
      uVar7 = 0;
      if (*inputs[1] != 0x20) {
        uVar7 = *(uint *)((long)*inputs + lVar5 * 4) >> ((byte)*inputs[1] & 0x1f) & uVar4;
      }
      uVar6 = uVar7 & 1 << (bVar2 - 1 & 0x1f);
      if (uVar6 != 0) {
        uVar6 = ~uVar4;
      }
      if (3 < dataType - TYPE_INT) {
        uVar6 = 0;
      }
      if (*(uint *)((long)*outputs + lVar5 * 4) != (uVar6 | uVar7)) {
        this_00 = &(this->super_IntegerFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
        stream = (ostream *)std::ostream::operator<<(this_00,(int)lVar5);
        std::__ostream_insert<char,std::char_traits<char>>(stream,"] = ",4);
        local_38.value = (deUint64)(uVar6 | uVar7);
        tcu::Format::Hex<8UL>::toStream(&local_38,stream);
        return bVar3;
      }
      lVar5 = lVar5 + 1;
      bVar3 = iVar1 <= (int)lVar5;
    } while (iVar1 != (int)lVar5);
  }
  return bVar3;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const bool				isSigned		= glu::isDataTypeIntOrIVec(type);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				offset			= *((const int*)inputs[1]);
		const int				bits			= *((const int*)inputs[2]);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	out		= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	valMask	= (bits == 32 ? ~0u : ((1u<<bits)-1u));
			const deUint32	baseVal	= (offset == 32) ? (0) : ((value >> offset) & valMask);
			const deUint32	ref		= baseVal | ((isSigned && (baseVal & (1<<(bits-1)))) ? ~valMask : 0u);

			if (out != ref)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref);
				return false;
			}
		}

		return true;
	}